

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

XXH_errorcode XXH64_update(XXH64_state_t *state_in,void *input,size_t len)

{
  int iVar1;
  BYTE *pBVar2;
  U64 UVar3;
  U64 UVar4;
  XXH_endianess endian_detected;
  size_t len_local;
  void *input_local;
  XXH64_state_t *state_in_local;
  U64 local_340;
  U64 v4_1;
  U64 v3_1;
  U64 v2_1;
  U64 v1_1;
  BYTE *limit_1;
  BYTE *bEnd_1;
  BYTE *p_1;
  XXH_errorcode local_2e4;
  U64 local_2e0;
  U64 v4;
  U64 v3;
  U64 v2;
  U64 v1;
  BYTE *limit;
  BYTE *bEnd;
  BYTE *p;
  XXH_errorcode local_288;
  
  iVar1 = XXH_isLittleEndian();
  if (iVar1 == 1) {
    pBVar2 = (BYTE *)((long)input + len);
    if (input == (void *)0x0) {
      local_288 = XXH_ERROR;
    }
    else {
      state_in->total_len = len + state_in->total_len;
      if (state_in->memsize + len < 0x20) {
        XXH_memcpy((void *)((long)state_in->mem64 + (ulong)state_in->memsize),input,len);
        state_in->memsize = (int)len + state_in->memsize;
        local_288 = XXH_OK;
      }
      else {
        bEnd = (BYTE *)input;
        if (state_in->memsize != 0) {
          XXH_memcpy((void *)((long)state_in->mem64 + (ulong)state_in->memsize),input,
                     (ulong)(0x20 - state_in->memsize));
          UVar4 = state_in->v1;
          UVar3 = XXH_read64(state_in->mem64);
          UVar4 = XXH64_round(UVar4,UVar3);
          state_in->v1 = UVar4;
          UVar4 = state_in->v2;
          UVar3 = XXH_read64(state_in->mem64 + 1);
          UVar4 = XXH64_round(UVar4,UVar3);
          state_in->v2 = UVar4;
          UVar4 = state_in->v3;
          UVar3 = XXH_read64(state_in->mem64 + 2);
          UVar4 = XXH64_round(UVar4,UVar3);
          state_in->v3 = UVar4;
          UVar4 = state_in->v4;
          UVar3 = XXH_read64(state_in->mem64 + 3);
          UVar4 = XXH64_round(UVar4,UVar3);
          state_in->v4 = UVar4;
          bEnd = (BYTE *)((long)input + (ulong)(0x20 - state_in->memsize));
          state_in->memsize = 0;
        }
        if (bEnd + 0x20 <= pBVar2) {
          v2 = state_in->v1;
          v3 = state_in->v2;
          v4 = state_in->v3;
          local_2e0 = state_in->v4;
          do {
            UVar4 = XXH_read64(bEnd);
            v2 = XXH64_round(v2,UVar4);
            UVar4 = XXH_read64(bEnd + 8);
            v3 = XXH64_round(v3,UVar4);
            UVar4 = XXH_read64(bEnd + 0x10);
            v4 = XXH64_round(v4,UVar4);
            UVar4 = XXH_read64(bEnd + 0x18);
            local_2e0 = XXH64_round(local_2e0,UVar4);
            bEnd = bEnd + 0x20;
          } while (bEnd <= pBVar2 + -0x20);
          state_in->v1 = v2;
          state_in->v2 = v3;
          state_in->v3 = v4;
          state_in->v4 = local_2e0;
        }
        if (bEnd < pBVar2) {
          XXH_memcpy(state_in->mem64,bEnd,(long)pBVar2 - (long)bEnd);
          state_in->memsize = (int)pBVar2 - (int)bEnd;
        }
        local_288 = XXH_OK;
      }
    }
    state_in_local._4_4_ = local_288;
  }
  else {
    pBVar2 = (BYTE *)((long)input + len);
    if (input == (void *)0x0) {
      local_2e4 = XXH_ERROR;
    }
    else {
      state_in->total_len = len + state_in->total_len;
      if (state_in->memsize + len < 0x20) {
        XXH_memcpy((void *)((long)state_in->mem64 + (ulong)state_in->memsize),input,len);
        state_in->memsize = (int)len + state_in->memsize;
        local_2e4 = XXH_OK;
      }
      else {
        bEnd_1 = (BYTE *)input;
        if (state_in->memsize != 0) {
          XXH_memcpy((void *)((long)state_in->mem64 + (ulong)state_in->memsize),input,
                     (ulong)(0x20 - state_in->memsize));
          UVar4 = state_in->v1;
          UVar3 = XXH_read64(state_in->mem64);
          UVar3 = XXH_swap64(UVar3);
          UVar4 = XXH64_round(UVar4,UVar3);
          state_in->v1 = UVar4;
          UVar4 = state_in->v2;
          UVar3 = XXH_read64(state_in->mem64 + 1);
          UVar3 = XXH_swap64(UVar3);
          UVar4 = XXH64_round(UVar4,UVar3);
          state_in->v2 = UVar4;
          UVar4 = state_in->v3;
          UVar3 = XXH_read64(state_in->mem64 + 2);
          UVar3 = XXH_swap64(UVar3);
          UVar4 = XXH64_round(UVar4,UVar3);
          state_in->v3 = UVar4;
          UVar4 = state_in->v4;
          UVar3 = XXH_read64(state_in->mem64 + 3);
          UVar3 = XXH_swap64(UVar3);
          UVar4 = XXH64_round(UVar4,UVar3);
          state_in->v4 = UVar4;
          bEnd_1 = (BYTE *)((long)input + (ulong)(0x20 - state_in->memsize));
          state_in->memsize = 0;
        }
        if (bEnd_1 + 0x20 <= pBVar2) {
          v2_1 = state_in->v1;
          v3_1 = state_in->v2;
          v4_1 = state_in->v3;
          local_340 = state_in->v4;
          do {
            UVar4 = XXH_read64(bEnd_1);
            UVar4 = XXH_swap64(UVar4);
            v2_1 = XXH64_round(v2_1,UVar4);
            UVar4 = XXH_read64(bEnd_1 + 8);
            UVar4 = XXH_swap64(UVar4);
            v3_1 = XXH64_round(v3_1,UVar4);
            UVar4 = XXH_read64(bEnd_1 + 0x10);
            UVar4 = XXH_swap64(UVar4);
            v4_1 = XXH64_round(v4_1,UVar4);
            UVar4 = XXH_read64(bEnd_1 + 0x18);
            UVar4 = XXH_swap64(UVar4);
            local_340 = XXH64_round(local_340,UVar4);
            bEnd_1 = bEnd_1 + 0x20;
          } while (bEnd_1 <= pBVar2 + -0x20);
          state_in->v1 = v2_1;
          state_in->v2 = v3_1;
          state_in->v3 = v4_1;
          state_in->v4 = local_340;
        }
        if (bEnd_1 < pBVar2) {
          XXH_memcpy(state_in->mem64,bEnd_1,(long)pBVar2 - (long)bEnd_1);
          state_in->memsize = (int)pBVar2 - (int)bEnd_1;
        }
        local_2e4 = XXH_OK;
      }
    }
    state_in_local._4_4_ = local_2e4;
  }
  return state_in_local._4_4_;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH64_update (XXH64_state_t* state_in, const void* input, size_t len)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_update_endian(state_in, input, len, XXH_littleEndian);
    else
        return XXH64_update_endian(state_in, input, len, XXH_bigEndian);
}